

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.h
# Opt level: O2

void __thiscall
Js::JavascriptPromiseReaction::JavascriptPromiseReaction
          (JavascriptPromiseReaction *this,JavascriptPromiseCapability *capabilities,
          RecyclableObject *handler)

{
  (this->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_013cc028;
  Memory::WriteBarrierPtr<Js::JavascriptPromiseCapability>::WriteBarrierSet
            (&this->capabilities,capabilities);
  Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierSet(&this->handler,handler);
  return;
}

Assistant:

JavascriptPromiseReaction(JavascriptPromiseCapability* capabilities, RecyclableObject* handler)
            : capabilities(capabilities), handler(handler)
        { }